

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O1

cstr idx2::ToRawFileName(metadata *Meta)

{
  int iVar1;
  int iVar2;
  name_map *pnVar3;
  dtype dVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long *in_FS_OFFSET;
  bool bVar8;
  printer Pr;
  printer local_30;
  
  pcVar7 = (char *)(*in_FS_OFFSET + -0x180);
  printer::printer(&local_30,pcVar7,0x180);
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar7 = "false && \"buffer too small\"";
LAB_0019bc43:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x16,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"%s-",Meta);
    local_30.Buf = local_30.Buf + iVar2;
    iVar1 = local_30.Size - iVar2;
    bVar8 = local_30.Size < iVar2;
    local_30.Size = iVar1;
    if (iVar1 == 0 || bVar8) {
      pcVar7 = "false && \"buffer overflow?\"";
      goto LAB_0019bc43;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0019bc43;
    }
    fprintf((FILE *)local_30.File,"%s-",Meta);
  }
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar7 = "false && \"buffer too small\"";
LAB_0019bc74:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x17,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar1 = snprintf(local_30.Buf,(long)local_30.Size,"%s-",Meta->Field);
    local_30.Buf = local_30.Buf + iVar1;
    iVar2 = local_30.Size - iVar1;
    if (local_30.Size - iVar1 == 0 || local_30.Size < iVar1) {
      pcVar7 = "false && \"buffer overflow?\"";
      goto LAB_0019bc74;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0019bc74;
    }
    fprintf((FILE *)local_30.File,"%s-",Meta->Field);
    iVar2 = local_30.Size;
  }
  local_30.Size = iVar2;
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar7 = "false && \"buffer too small\"";
    }
    else {
      iVar1 = snprintf(local_30.Buf,(long)local_30.Size,"[%d-%d-%d]-",
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      local_30.Buf = local_30.Buf + iVar1;
      iVar2 = local_30.Size - iVar1;
      if (local_30.Size - iVar1 != 0 && iVar1 <= local_30.Size) goto LAB_0019bb0d;
      pcVar7 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
      fprintf((FILE *)local_30.File,"[%d-%d-%d]-",(ulong)(uint)(Meta->Dims3).field_0.field_0.X,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      iVar2 = local_30.Size;
LAB_0019bb0d:
      local_30.Size = iVar2;
      pnVar3 = &dtype_s::NameMap;
      dVar4 = dtype_s::NameMap.Arr[0].ItemVal;
      if (dtype_s::NameMap.Arr[0].ItemVal != Meta->DType) {
        lVar5 = 0x28;
        do {
          if (lVar5 == 0x100) {
            dVar4 = __Invalid__;
            break;
          }
          dVar4 = *(dtype *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar5);
          lVar5 = lVar5 + 0x18;
        } while (dVar4 != Meta->DType);
      }
      if (dtype_s::NameMap.Arr[0].ItemVal == dVar4) {
        bVar8 = false;
      }
      else {
        lVar5 = 0;
        do {
          lVar6 = lVar5;
          bVar8 = lVar6 == 0xd8;
          if (bVar8) goto LAB_0019bc0b;
          lVar5 = lVar6 + 0x18;
        } while ((&dtype_s::NameMap.Arr[1].ItemVal)[lVar6] != dVar4);
        pnVar3 = (name_map *)((long)&dtype_s::NameMap.Arr[1].Name.field_0 + lVar6);
      }
      if (!bVar8) {
        if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
          if ((long)local_30.Size < 2) {
            pcVar7 = "false && \"buffer too small\"";
          }
          else {
            iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"%.*s");
            local_30.Buf = local_30.Buf + iVar2;
            if (iVar2 < local_30.Size) {
              return pcVar7;
            }
            pcVar7 = "false && \"buffer overflow?\"";
          }
        }
        else {
          if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
            fprintf((FILE *)local_30.File,"%.*s",(ulong)(uint)pnVar3->Arr[0].Name.Size,
                    pnVar3->Arr[0].Name.field_0.Ptr);
            return pcVar7;
          }
          pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
        }
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                      ,0x1a,"cstr idx2::ToRawFileName(const metadata &)");
      }
LAB_0019bc0b:
      __assert_fail("It != End(EnumS.NameMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataTypes.h"
                    ,10,"stref idx2::ToString(dtype)");
    }
    pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                ,0x18,"cstr idx2::ToRawFileName(const metadata &)");
}

Assistant:

cstr
ToRawFileName(const metadata& Meta)
{
  printer Pr(Meta.String, sizeof(Meta.String));
  idx2_Print(&Pr, "%s-", Meta.Name);
  idx2_Print(&Pr, "%s-", Meta.Field);
  idx2_Print(&Pr, "[%d-%d-%d]-", Meta.Dims3.X, Meta.Dims3.Y, Meta.Dims3.Z);
  stref TypeStr = ToString(Meta.DType);
  idx2_Print(&Pr, "%.*s", TypeStr.Size, TypeStr.Ptr);

  return Meta.String;
}